

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Cnf_Dat_t * Jf_ManCreateCnf(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *pCVar3;
  int **ppiVar4;
  long lVar5;
  int *piVar6;
  int *__s;
  uint uVar7;
  long lVar8;
  size_t __size;
  
  pCVar3 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar3->pMan = (Aig_Man_t *)p;
  pCVar3->nVars = p->nObjs;
  iVar1 = vLits->nSize;
  pCVar3->nLiterals = iVar1;
  iVar2 = vClas->nSize;
  pCVar3->nClauses = iVar2;
  ppiVar4 = (int **)malloc((long)iVar2 * 8 + 8);
  pCVar3->pClauses = ppiVar4;
  piVar6 = vLits->pArray;
  vLits->nCap = 0;
  vLits->nSize = 0;
  vLits->pArray = (int *)0x0;
  *ppiVar4 = piVar6;
  lVar5 = (long)vClas->nSize;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  else {
    piVar6 = vClas->pArray;
    lVar8 = 0;
    do {
      ppiVar4[lVar8] = *ppiVar4 + piVar6[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
    piVar6 = *ppiVar4;
  }
  ppiVar4[lVar5] = piVar6 + iVar1;
  __size = (long)p->nObjs << 2;
  piVar6 = (int *)malloc(__size);
  memset(piVar6,0xff,__size);
  pCVar3->pObj2Clause = piVar6;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  pCVar3->pObj2Count = __s;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      if (*ppiVar4[lVar5] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar7 = (uint)*ppiVar4[lVar5] >> 1;
      if (piVar6[uVar7] == -1) {
        piVar6[uVar7] = (int)lVar5;
        __s[uVar7] = 1;
      }
      else {
        if (__s[uVar7] < 1) {
          __assert_fail("pCnf->pObj2Count[iOut] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                        ,0xe2,"Cnf_Dat_t *Jf_ManCreateCnf(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        __s[uVar7] = __s[uVar7] + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  return pCVar3;
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnf( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas )
{
    Cnf_Dat_t * pCnf; 
    int i, Entry, iOut;
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = Gia_ManObjNum(p);
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    // create mapping of objects into their clauses
    pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p) );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        iOut = Abc_Lit2Var(pCnf->pClauses[i][0]);
        if ( pCnf->pObj2Clause[iOut] == -1 )
        {
            pCnf->pObj2Clause[iOut] = i;
            pCnf->pObj2Count[iOut] = 1;
        }
        else
        {
            assert( pCnf->pObj2Count[iOut] > 0 );
            pCnf->pObj2Count[iOut]++;
        }
    }
    return pCnf;
}